

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O0

ExprBase *
CreateVirtualFunctionSet
          (ExpressionContext *ctx,SynBase *source,ExprBase *value,InplaceStr name,TypeClass *parent)

{
  IntrusiveList<FunctionHandle> functions_00;
  bool bVar1;
  uint hash;
  DirectChainedMap<FunctionData_*> *this;
  bool_type bVar2;
  FunctionHandle *this_00;
  ExprFunctionOverloadSet *this_01;
  ArrayView<TypeBase_*> setTypes;
  NodeIterator NVar3;
  NodeIterator NVar4;
  ArrayView<TypeBase*> local_198 [16];
  TypeFunctionSet *local_188;
  TypeFunctionSet *type;
  FunctionData *local_178;
  Node *pNStack_170;
  NodeIterator local_160;
  TypeBase *local_150;
  FunctionData *local_148;
  Node *pNStack_140;
  NodeIterator local_138;
  FunctionHandle *local_128;
  FunctionHandle *curr_1;
  FunctionHandle *prev;
  FunctionData *function;
  NodeIterator it;
  TypeClass *curr;
  undefined1 auStack_e8 [8];
  IntrusiveList<FunctionHandle> functions;
  SmallArray<TypeBase_*,_16U> types;
  TypeClass *parent_local;
  ExprBase *value_local;
  SynBase *source_local;
  ExpressionContext *ctx_local;
  InplaceStr name_local;
  
  name_local.begin = name.end;
  ctx_local = (ExpressionContext *)name.begin;
  SmallArray<TypeBase_*,_16U>::SmallArray
            ((SmallArray<TypeBase_*,_16U> *)&functions.tail,ctx->allocator);
  IntrusiveList<FunctionHandle>::IntrusiveList((IntrusiveList<FunctionHandle> *)auStack_e8);
  for (it.node = (Node *)parent; it.node != (Node *)0x0; it.node = *(Node **)(it.node + 0x118)) {
    this = (DirectChainedMap<FunctionData_*> *)(it.node + 0x168);
    hash = InplaceStr::hash((InplaceStr *)&ctx_local);
    NVar3 = DirectChainedMap<FunctionData_*>::first(this,hash);
    NVar4 = local_160;
    while( true ) {
      it.start = NVar3.node;
      function = (FunctionData *)NVar3.start;
      local_160 = NVar4;
      bVar2 = DirectChainedMap::NodeIterator::operator_cast_to_function_pointer
                        ((NodeIterator *)&function);
      if (bVar2 == 0) break;
      prev = *(FunctionHandle **)(it.start + 8);
      curr_1 = (FunctionHandle *)0x0;
      if ((*(byte *)(*(long *)&prev[1].listed + 0x3c) & 1) == 0) {
        for (local_128 = (FunctionHandle *)auStack_e8; local_128 != (FunctionHandle *)0x0;
            local_128 = local_128->next) {
          if (local_128->function->type == *(TypeFunction **)&prev[1].listed) {
            curr_1 = local_128;
            break;
          }
        }
      }
      if (curr_1 == (FunctionHandle *)0x0) {
        local_150 = *(TypeBase **)&prev[1].listed;
        SmallArray<TypeBase_*,_16U>::push_back
                  ((SmallArray<TypeBase_*,_16U> *)&functions.tail,&local_150);
        this_00 = ExpressionContext::get<FunctionHandle>(ctx);
        FunctionHandle::FunctionHandle(this_00,(FunctionData *)prev);
        IntrusiveList<FunctionHandle>::push_back
                  ((IntrusiveList<FunctionHandle> *)auStack_e8,this_00);
        local_178 = function;
        pNStack_170 = it.start;
        NVar4.node = it.start;
        NVar4.start = (Node *)function;
        NVar4 = DirectChainedMap<FunctionData_*>::next
                          ((DirectChainedMap<FunctionData_*> *)(it.node + 0x168),NVar4);
        NVar3 = NVar4;
      }
      else {
        local_148 = function;
        pNStack_140 = it.start;
        NVar3.node = it.start;
        NVar3.start = (Node *)function;
        NVar3 = DirectChainedMap<FunctionData_*>::next
                          ((DirectChainedMap<FunctionData_*> *)(it.node + 0x168),NVar3);
        local_138 = NVar3;
        NVar4 = local_160;
      }
    }
  }
  bVar1 = IntrusiveList<FunctionHandle>::empty((IntrusiveList<FunctionHandle> *)auStack_e8);
  if (bVar1) {
    if ((TypeStruct *)value->type != ctx->typeAutoRef) {
      name_local.end = (char *)0x0;
      goto LAB_0019b459;
    }
    anon_unknown.dwarf_6f1cc::Stop
              (ctx,source,"ERROR: function \'%.*s\' is undefined in any of existing classes",
               (ulong)(uint)((int)name_local.begin - (int)ctx_local));
  }
  ArrayView<TypeBase*>::ArrayView<16u>(local_198,(SmallArray<TypeBase_*,_16U> *)&functions.tail);
  setTypes._12_4_ = 0;
  setTypes._0_12_ = local_198._0_12_;
  local_188 = ExpressionContext::GetFunctionSetType(ctx,setTypes);
  this_01 = ExpressionContext::get<ExprFunctionOverloadSet>(ctx);
  functions_00.tail = functions.head;
  functions_00.head = (FunctionHandle *)auStack_e8;
  ExprFunctionOverloadSet::ExprFunctionOverloadSet
            (this_01,source,&local_188->super_TypeBase,functions_00,value);
  name_local.end = (char *)this_01;
LAB_0019b459:
  type._4_4_ = 1;
  SmallArray<TypeBase_*,_16U>::~SmallArray((SmallArray<TypeBase_*,_16U> *)&functions.tail);
  return (ExprBase *)name_local.end;
}

Assistant:

ExprBase* CreateVirtualFunctionSet(ExpressionContext &ctx, SynBase *source, ExprBase *value, InplaceStr name, TypeClass *parent)
{
	SmallArray<TypeBase*, 16> types(ctx.allocator);
	IntrusiveList<FunctionHandle> functions;

	for(TypeClass *curr = parent; curr; curr = curr->baseClass)
	{
		DirectChainedMap<FunctionData*>::NodeIterator it = curr->methodMap.first(name.hash());

		while(it)
		{
			FunctionData *function = it.node->value;

			FunctionHandle *prev = NULL;

			// Pointer to generic types don't stricly match because they might be resolved to different types
			if(!function->type->isGeneric)
			{
				for(FunctionHandle *curr = functions.head; curr; curr = curr->next)
				{
					if(curr->function->type == function->type)
					{
						prev = curr;
						break;
					}
				}
			}

			if(prev)
			{
				it = curr->methodMap.next(it);
				continue;
			}

			types.push_back(function->type);
			functions.push_back(new (ctx.get<FunctionHandle>()) FunctionHandle(function));

			it = curr->methodMap.next(it);
		}
	}

	if(functions.empty())
	{
		if(value->type != ctx.typeAutoRef)
			return NULL;

		Stop(ctx, source, "ERROR: function '%.*s' is undefined in any of existing classes", FMT_ISTR(name));
	}

	TypeFunctionSet *type = ctx.GetFunctionSetType(types);

	return new (ctx.get<ExprFunctionOverloadSet>()) ExprFunctionOverloadSet(source, type, functions, value);
}